

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O0

void LiteScript::StateExecutor::I_DEFINE_RETURN(State *state,Instruction *instr)

{
  size_type sVar1;
  reference t;
  reference this;
  Nullable<LiteScript::Variable> local_38;
  Instruction *local_18;
  Instruction *instr_local;
  State *state_local;
  
  state->line_num = state->line_num + 1;
  local_18 = instr;
  instr_local = (Instruction *)state;
  sVar1 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::size
                    (&state->op_lifo);
  if (sVar1 != 0) {
    t = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::back
                  ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)
                   (instr_local + 9));
    Nullable<LiteScript::Variable>::Nullable(&local_38,t);
    this = std::
           vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
           ::back((vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                   *)&instr_local[7].comp_value);
    Nullable<LiteScript::Variable>::operator=(this,&local_38);
    Nullable<LiteScript::Variable>::~Nullable(&local_38);
    PopValue((State *)instr_local);
  }
  return;
}

Assistant:

void LiteScript::StateExecutor::I_DEFINE_RETURN(State& state, Instruction& instr) {
    state.line_num++;
    if (state.op_lifo.size() == 0)
        return;
    state.rets.back() = Nullable<Variable>(state.op_lifo.back());
    PopValue(state);
}